

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic.c
# Opt level: O1

int getgoal(line *dlp)

{
  byte bVar1;
  int col;
  int iVar2;
  ushort **ppuVar3;
  long lVar4;
  uint uVar5;
  char local_35 [8];
  char tmp [5];
  
  if (dlp->l_used < 1) {
    lVar4 = 0;
  }
  else {
    lVar4 = 0;
    col = 0;
    do {
      bVar1 = dlp->l_text[lVar4];
      uVar5 = (uint)bVar1;
      if (uVar5 == 9) {
        col = ntabstop(col,curbp->b_tabw);
      }
      else if ((cinfo[uVar5] & 8U) == 0) {
        ppuVar3 = __ctype_b_loc();
        if ((*(byte *)((long)*ppuVar3 + (ulong)uVar5 * 2 + 1) & 0x40) == 0) {
          iVar2 = snprintf(local_35,5,"\\%o",(ulong)bVar1);
          col = col + iVar2;
        }
        else {
          col = col + 1;
        }
      }
      else {
        col = col + 2;
      }
    } while ((col <= curgoal) && (lVar4 = lVar4 + 1, lVar4 < dlp->l_used));
  }
  return (int)lVar4;
}

Assistant:

int
getgoal(struct line *dlp)
{
	int c, i, col = 0;
	char tmp[5];

	for (i = 0; i < llength(dlp); i++) {
		c = lgetc(dlp, i);
		if (c == '\t') {
			col = ntabstop(col, curbp->b_tabw);
		} else if (ISCTRL(c) != FALSE) {
			col += 2;
		} else if (isprint(c))
			col++;
		else {
			col += snprintf(tmp, sizeof(tmp), "\\%o", c);
		}
		if (col > curgoal)
			break;
	}
	return (i);
}